

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::str_format_internal::Summarize_abi_cxx11_
          (string *__return_storage_ptr__,str_format_internal *this,UntypedFormatSpecImpl format,
          Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args)

{
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  UntypedFormatSpecImpl format_00;
  bool bVar1;
  allocator<char> local_4c1;
  SummarizingConverter local_4c0;
  pointer local_4b8;
  pointer pFStack_4b0;
  str_format_internal *local_4a8;
  void *pvStack_4a0;
  FormatRawSinkImpl local_480;
  undefined1 local_470 [8];
  FormatSinkImpl sink;
  string out;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_local;
  UntypedFormatSpecImpl format_local;
  
  std::__cxx11::string::string((string *)(sink.buf_ + 0x3f8));
  FormatRawSinkImpl::
  FormatRawSinkImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (&local_480,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (sink.buf_ + 0x3f8));
  FormatSinkImpl::FormatSinkImpl((FormatSinkImpl *)local_470,local_480);
  local_4b8 = (pointer)format.size_;
  pFStack_4b0 = args.ptr_;
  local_4a8 = this;
  pvStack_4a0 = format.data_;
  anon_unknown_3::SummarizingConverter::SummarizingConverter(&local_4c0,(FormatSinkImpl *)local_470)
  ;
  format_00.size_ = (size_t)pvStack_4a0;
  format_00.data_ = local_4a8;
  args_00.len_ = (size_type)pFStack_4b0;
  args_00.ptr_ = local_4b8;
  bVar1 = anon_unknown_3::
          ConvertAll<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                    (format_00,args_00,local_4c0);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_4c1);
    std::allocator<char>::~allocator(&local_4c1);
  }
  FormatSinkImpl::~FormatSinkImpl((FormatSinkImpl *)local_470);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(sink.buf_ + 0x3f8));
  }
  std::__cxx11::string::~string((string *)(sink.buf_ + 0x3f8));
  return __return_storage_ptr__;
}

Assistant:

std::string Summarize(const UntypedFormatSpecImpl format,
                      absl::Span<const FormatArgImpl> args) {
  typedef SummarizingConverter Converter;
  std::string out;
  {
    // inner block to destroy sink before returning out. It ensures a last
    // flush.
    FormatSinkImpl sink(&out);
    if (!ConvertAll(format, args, Converter(&sink))) {
      return "";
    }
  }
  return out;
}